

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution1D_x86_avx::forward
          (Convolution1D_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int *piVar1;
  Layer *pLVar2;
  void **ppvVar3;
  undefined8 in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  Mat weights [2];
  ParamDict pd;
  Layer *op;
  Mat *_bias_data;
  Mat bias_data_flattened;
  Mat weight_data_flattened;
  int _num_output;
  int _kernel_w;
  Mat *top_blob;
  Mat *_weight_data;
  Mat *bottom_blob;
  ParamDict *in_stack_fffffffffffffbc0;
  Mat *in_stack_fffffffffffffbc8;
  void **ppvVar4;
  int in_stack_fffffffffffffbd4;
  Mat *in_stack_fffffffffffffbd8;
  ParamDict *in_stack_fffffffffffffbe0;
  Option *in_stack_fffffffffffffbf0;
  Mat *in_stack_fffffffffffffbf8;
  Mat *in_stack_fffffffffffffc00;
  void **local_3e8;
  void **local_398;
  undefined1 local_338 [16];
  void *local_328;
  int *local_320;
  void *local_318;
  undefined4 local_310;
  long *local_308;
  undefined4 local_300;
  undefined4 local_2fc;
  undefined4 local_2f8;
  undefined4 local_2f4;
  undefined4 local_2f0;
  void *local_2e8;
  void *local_2e0;
  int *local_2d8;
  void *local_2d0;
  undefined4 local_2c8;
  long *local_2c0;
  undefined4 local_2b8;
  undefined4 local_2b4;
  undefined4 local_2b0;
  undefined4 local_2ac;
  undefined4 local_2a8;
  void *local_2a0;
  void *pvStack_298;
  ParamDict local_290;
  Layer *local_280;
  const_reference local_278;
  void *local_270;
  int *local_268;
  ulong local_260;
  int local_258;
  long *local_250;
  undefined4 local_248;
  int local_244;
  undefined4 local_240;
  undefined4 local_23c;
  int local_238;
  long local_230;
  undefined4 local_228;
  void *local_218;
  int *local_210;
  ulong local_208;
  int local_200;
  long *local_1f8;
  undefined4 local_1f0;
  int local_1ec;
  undefined4 local_1e8;
  undefined4 local_1e4;
  int local_1e0;
  long local_1d8;
  int local_1d0;
  int local_1cc;
  reference local_1c8;
  const_reference local_1c0;
  const_reference local_1b8;
  undefined8 local_1b0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_1a8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_1a0;
  int local_18c;
  void **local_188;
  void **local_180;
  void **local_178;
  void **local_170;
  void **local_168;
  void **local_148;
  int local_140;
  undefined4 local_13c;
  void **local_138;
  void **local_118;
  int local_110;
  undefined4 local_10c;
  void **local_108;
  void **local_e8;
  int local_e0;
  undefined4 local_dc;
  void **local_d8;
  int local_b8;
  undefined4 local_b4;
  void **local_b0;
  void **local_a8;
  void **local_a0;
  int local_98;
  undefined4 local_94;
  void **local_90;
  int local_88;
  undefined4 local_84;
  void **local_80;
  void **local_78;
  void **local_70;
  int local_68;
  undefined4 local_64;
  void **local_60;
  void *local_40;
  void *local_30;
  void *local_20;
  void **local_10;
  void **local_8;
  
  local_1b0 = in_RCX;
  local_1a8 = in_RDX;
  local_1a0 = in_RSI;
  local_1b8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_1c0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1a0,1);
  local_1c8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1a8,0);
  local_1cc = local_1c0->w;
  local_1d0 = local_1c0->c * local_1c0->elempack;
  local_188 = &local_218;
  local_218 = (void *)0x0;
  local_210 = (int *)0x0;
  local_208 = 0;
  local_200 = 0;
  local_1f8 = (long *)0x0;
  local_1f0 = 0;
  local_1ec = 0;
  local_1e8 = 0;
  local_1e4 = 0;
  local_1e0 = 0;
  local_1d8 = 0;
  flatten(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  local_168 = &local_218;
  if (local_218 != (void *)0x0) {
    local_10 = local_168;
  }
  if (local_218 == (void *)0x0 || local_1d8 * local_1e0 == 0) {
    local_18c = -100;
    local_228 = 1;
    goto LAB_01d2f791;
  }
  local_1ec = local_200 * local_1ec;
  local_208 = local_208 / (ulong)(long)local_200;
  local_200 = 1;
  local_180 = &local_270;
  local_270 = (void *)0x0;
  local_268 = (int *)0x0;
  local_260 = 0;
  local_258 = 0;
  local_250 = (long *)0x0;
  local_248 = 0;
  local_244 = 0;
  local_240 = 0;
  local_23c = 0;
  local_238 = 0;
  local_230 = 0;
  if (*(int *)(in_RDI + 0xec) == 0) {
LAB_01d2ea9c:
    local_280 = create_layer_cpu((int)((ulong)in_stack_fffffffffffffbc8 >> 0x20));
    ParamDict::ParamDict(in_stack_fffffffffffffbe0);
    ParamDict::set(&local_290,0,local_1d0);
    ParamDict::set(&local_290,1,local_1cc);
    ParamDict::set(&local_290,2,*(int *)(in_RDI + 0xd8));
    ParamDict::set(&local_290,3,*(int *)(in_RDI + 0xdc));
    ParamDict::set(&local_290,4,*(int *)(in_RDI + 0xe0));
    ParamDict::set(&local_290,0xf,*(int *)(in_RDI + 0xe4));
    ParamDict::set(&local_290,0x12,*(float *)(in_RDI + 0xe8));
    ParamDict::set(&local_290,5,*(int *)(in_RDI + 0xec));
    ParamDict::set(&local_290,6,local_1ec);
    ParamDict::set(&local_290,9,*(int *)(in_RDI + 0xf4));
    ParamDict::set((ParamDict *)in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,
                   in_stack_fffffffffffffbc8);
    (*local_280->_vptr_Layer[2])(local_280,&local_290);
    local_398 = &local_328;
    do {
      local_178 = local_398;
      *local_398 = (void *)0x0;
      local_398[1] = (void *)0x0;
      local_398[2] = (void *)0x0;
      *(undefined4 *)(local_398 + 3) = 0;
      local_398[4] = (void *)0x0;
      *(undefined4 *)(local_398 + 5) = 0;
      *(undefined4 *)((long)local_398 + 0x2c) = 0;
      *(undefined4 *)(local_398 + 6) = 0;
      *(undefined4 *)((long)local_398 + 0x34) = 0;
      *(undefined4 *)(local_398 + 7) = 0;
      local_398[8] = (void *)0x0;
      local_398 = local_398 + 9;
    } while (local_398 != &pvStack_298);
    local_80 = &local_218;
    local_78 = &local_328;
    if (&local_328 != local_80) {
      if (local_210 != (int *)0x0) {
        local_84 = 1;
        LOCK();
        local_88 = *local_210;
        *local_210 = *local_210 + 1;
        UNLOCK();
      }
      local_60 = &local_328;
      if (local_320 != (int *)0x0) {
        local_64 = 0xffffffff;
        LOCK();
        local_68 = *local_320;
        *local_320 = *local_320 + -1;
        UNLOCK();
        if (local_68 == 1) {
          if (local_308 == (long *)0x0) {
            if (local_328 != (void *)0x0) {
              free(local_328);
            }
          }
          else {
            (**(code **)(*local_308 + 0x18))(local_308,local_328);
          }
        }
      }
      local_328 = *local_80;
      local_320 = (int *)local_80[1];
      local_318 = local_80[2];
      local_310 = *(undefined4 *)(local_80 + 3);
      local_308 = (long *)local_80[4];
      local_300 = *(undefined4 *)(local_80 + 5);
      local_2fc = *(undefined4 *)((long)local_80 + 0x2c);
      local_2f8 = *(undefined4 *)(local_80 + 6);
      local_2f4 = *(undefined4 *)((long)local_80 + 0x34);
      local_2f0 = *(undefined4 *)(local_80 + 7);
      local_2e8 = local_80[8];
    }
    local_b0 = &local_270;
    local_a8 = &local_2e0;
    local_70 = &local_328;
    if (&local_2e0 != local_b0) {
      if (local_268 != (int *)0x0) {
        local_b4 = 1;
        LOCK();
        local_b8 = *local_268;
        *local_268 = *local_268 + 1;
        UNLOCK();
      }
      local_90 = &local_2e0;
      if (local_2d8 != (int *)0x0) {
        local_94 = 0xffffffff;
        LOCK();
        local_98 = *local_2d8;
        *local_2d8 = *local_2d8 + -1;
        UNLOCK();
        if (local_98 == 1) {
          if (local_2c0 == (long *)0x0) {
            if (local_2e0 != (void *)0x0) {
              free(local_2e0);
            }
          }
          else {
            (**(code **)(*local_2c0 + 0x18))(local_2c0,local_2e0);
          }
        }
      }
      local_2e0 = *local_b0;
      local_2d8 = (int *)local_b0[1];
      local_2d0 = local_b0[2];
      local_2c8 = *(undefined4 *)(local_b0 + 3);
      local_2c0 = (long *)local_b0[4];
      local_2b8 = *(undefined4 *)(local_b0 + 5);
      local_2b4 = *(undefined4 *)((long)local_b0 + 0x2c);
      local_2b0 = *(undefined4 *)(local_b0 + 6);
      local_2ac = *(undefined4 *)((long)local_b0 + 0x34);
      local_2a8 = *(undefined4 *)(local_b0 + 7);
      local_2a0 = local_b0[8];
    }
    pLVar2 = local_280;
    local_a0 = &local_2e0;
    ModelBinFromMatArray::ModelBinFromMatArray
              ((ModelBinFromMatArray *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
    (*pLVar2->_vptr_Layer[3])(pLVar2,local_338);
    ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffffbc0);
    (*local_280->_vptr_Layer[4])(local_280,local_1b0);
    (*local_280->_vptr_Layer[7])(local_280,local_1b8,local_1c8,local_1b0);
    (*local_280->_vptr_Layer[5])(local_280,local_1b0);
    if (local_280 != (Layer *)0x0) {
      (*local_280->_vptr_Layer[1])();
    }
    local_18c = 0;
    local_228 = 1;
    local_3e8 = &pvStack_298;
    do {
      ppvVar3 = local_3e8 + -9;
      ppvVar4 = ppvVar3;
      local_148 = ppvVar3;
      local_138 = ppvVar3;
      if (local_3e8[-8] != (void *)0x0) {
        piVar1 = (int *)local_3e8[-8];
        local_13c = 0xffffffff;
        LOCK();
        local_140 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_140 == 1) {
          if (local_3e8[-5] == (void *)0x0) {
            local_20 = *ppvVar3;
            if (local_20 != (void *)0x0) {
              free(local_20);
            }
          }
          else {
            (**(code **)(*local_3e8[-5] + 0x18))(local_3e8[-5],*ppvVar3);
          }
        }
      }
      *ppvVar3 = (void *)0x0;
      local_3e8[-7] = (void *)0x0;
      *(undefined4 *)(local_3e8 + -6) = 0;
      *(undefined4 *)(local_3e8 + -4) = 0;
      *(undefined4 *)((long)local_3e8 + -0x1c) = 0;
      *(undefined4 *)(local_3e8 + -3) = 0;
      *(undefined4 *)((long)local_3e8 + -0x14) = 0;
      *(undefined4 *)(local_3e8 + -2) = 0;
      local_3e8[-1] = (void *)0x0;
      local_3e8[-8] = (void *)0x0;
      local_3e8 = ppvVar4;
    } while (ppvVar4 != &local_328);
    ParamDict::~ParamDict(in_stack_fffffffffffffbc0);
  }
  else {
    local_278 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1a0,2);
    flatten(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
    local_170 = &local_270;
    if (local_270 != (void *)0x0) {
      local_8 = local_170;
    }
    if (local_270 != (void *)0x0 && local_230 * local_238 != 0) {
      local_244 = local_258 * local_244;
      local_260 = local_260 / (ulong)(long)local_258;
      local_258 = 1;
      goto LAB_01d2ea9c;
    }
    local_18c = -100;
    local_228 = 1;
  }
  ppvVar4 = &local_270;
  local_118 = ppvVar4;
  local_108 = ppvVar4;
  if (local_268 != (int *)0x0) {
    local_10c = 0xffffffff;
    LOCK();
    local_110 = *local_268;
    *local_268 = *local_268 + -1;
    UNLOCK();
    if (local_110 == 1) {
      if (local_250 == (long *)0x0) {
        local_30 = local_270;
        if (local_270 != (void *)0x0) {
          free(local_270);
        }
      }
      else {
        (**(code **)(*local_250 + 0x18))(local_250,local_270);
      }
    }
  }
  *ppvVar4 = (void *)0x0;
  ppvVar4[2] = (void *)0x0;
  *(undefined4 *)(ppvVar4 + 3) = 0;
  *(undefined4 *)(ppvVar4 + 5) = 0;
  *(undefined4 *)((long)ppvVar4 + 0x2c) = 0;
  *(undefined4 *)(ppvVar4 + 6) = 0;
  *(undefined4 *)((long)ppvVar4 + 0x34) = 0;
  *(undefined4 *)(ppvVar4 + 7) = 0;
  ppvVar4[8] = (void *)0x0;
  ppvVar4[1] = (void *)0x0;
LAB_01d2f791:
  ppvVar4 = &local_218;
  if (local_210 != (int *)0x0) {
    local_dc = 0xffffffff;
    LOCK();
    local_e0 = *local_210;
    *local_210 = *local_210 + -1;
    UNLOCK();
    if (local_e0 == 1) {
      local_e8 = ppvVar4;
      local_d8 = ppvVar4;
      if (local_1f8 == (long *)0x0) {
        local_40 = local_218;
        if (local_218 != (void *)0x0) {
          free(local_218);
        }
      }
      else {
        (**(code **)(*local_1f8 + 0x18))(local_1f8,local_218);
      }
    }
  }
  *ppvVar4 = (void *)0x0;
  ppvVar4[2] = (void *)0x0;
  *(undefined4 *)(ppvVar4 + 3) = 0;
  *(undefined4 *)(ppvVar4 + 5) = 0;
  *(undefined4 *)((long)ppvVar4 + 0x2c) = 0;
  *(undefined4 *)(ppvVar4 + 6) = 0;
  *(undefined4 *)((long)ppvVar4 + 0x34) = 0;
  *(undefined4 *)(ppvVar4 + 7) = 0;
  ppvVar4[8] = (void *)0x0;
  ppvVar4[1] = (void *)0x0;
  return local_18c;
}

Assistant:

int Convolution1D_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _kernel_w = _weight_data.w;
    const int _num_output = _weight_data.c * _weight_data.elempack;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    // weight_data_flattened as pack1
    weight_data_flattened.w *= weight_data_flattened.elempack;
    weight_data_flattened.elemsize /= weight_data_flattened.elempack;
    weight_data_flattened.elempack = 1;

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;

        // bias_data_flattened as pack1
        bias_data_flattened.w *= bias_data_flattened.elempack;
        bias_data_flattened.elemsize /= bias_data_flattened.elempack;
        bias_data_flattened.elempack = 1;
    }

    ncnn::Layer* op = ncnn::create_layer_cpu(ncnn::LayerType::Convolution1D);

    ncnn::ParamDict pd;
    pd.set(0, _num_output);
    pd.set(1, _kernel_w);
    pd.set(2, dilation_w);
    pd.set(3, stride_w);
    pd.set(4, pad_left);
    pd.set(15, pad_right);
    pd.set(18, pad_value);
    pd.set(5, bias_term);
    pd.set(6, weight_data_flattened.w);
    pd.set(9, activation_type);
    pd.set(10, activation_params);

    op->load_param(pd);

    ncnn::Mat weights[2];
    weights[0] = weight_data_flattened;
    weights[1] = bias_data_flattened;

    op->load_model(ncnn::ModelBinFromMatArray(weights));

    op->create_pipeline(opt);

    op->forward(bottom_blob, top_blob, opt);

    op->destroy_pipeline(opt);

    delete op;

    return 0;
}